

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O0

FT_UInt32 * tt_cmap14_variant_chars(TT_CMap cmap,FT_Memory memory,FT_UInt32 variantSelector)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  uint uVar6;
  FT_UInt FVar7;
  uint uVar8;
  FT_Error FVar9;
  byte *pbVar10;
  ulong uVar11;
  ulong uVar12;
  FT_UInt32 *ret;
  uint local_78;
  FT_UInt k;
  FT_UInt ni;
  FT_UInt di;
  FT_Byte *dp;
  uint local_60;
  FT_UInt32 nuni;
  FT_UInt32 dcnt;
  FT_UInt32 duni;
  FT_UInt32 numMappings;
  FT_UInt32 numRanges;
  TT_CMap14 cmap14;
  FT_ULong nondefOff;
  FT_ULong defOff;
  byte *pbStack_30;
  FT_Int i;
  FT_Byte *p;
  FT_UInt32 variantSelector_local;
  FT_Memory memory_local;
  TT_CMap cmap_local;
  
  pbVar10 = tt_cmap14_find_variant(cmap->data + 6,variantSelector);
  if (pbVar10 == (byte *)0x0) {
    cmap_local = (TT_CMap)0x0;
  }
  else {
    uVar11 = (ulong)((uint)*pbVar10 << 0x18 | (uint)pbVar10[1] << 0x10 | (uint)pbVar10[2] << 8 |
                    (uint)pbVar10[3]);
    uVar12 = (ulong)((uint)pbVar10[4] << 0x18 | (uint)pbVar10[5] << 0x10 | (uint)pbVar10[6] << 8 |
                    (uint)pbVar10[7]);
    if ((uVar11 == 0) && (uVar12 == 0)) {
      cmap_local = (TT_CMap)0x0;
    }
    else if (uVar11 == 0) {
      cmap_local = (TT_CMap)tt_cmap14_get_nondef_chars(cmap,cmap->data + uVar12,memory);
    }
    else if (uVar12 == 0) {
      cmap_local = (TT_CMap)tt_cmap14_get_def_chars(cmap,cmap->data + uVar11,memory);
    }
    else {
      pbStack_30 = cmap->data + uVar12;
      pbVar10 = cmap->data + uVar11;
      uVar6 = (uint)*pbStack_30 << 0x18 | (uint)pbStack_30[1] << 0x10 | (uint)pbStack_30[2] << 8 |
              (uint)pbStack_30[3];
      FVar7 = tt_cmap14_def_char_count(pbVar10);
      uVar8 = (uint)*pbVar10 << 0x18 | (uint)pbVar10[1] << 0x10 | (uint)pbVar10[2] << 8 |
              (uint)pbVar10[3];
      if (uVar6 == 0) {
        cmap_local = (TT_CMap)tt_cmap14_get_def_chars(cmap,cmap->data + uVar11,memory);
      }
      else if (FVar7 == 0) {
        cmap_local = (TT_CMap)tt_cmap14_get_nondef_chars(cmap,cmap->data + uVar12,memory);
      }
      else {
        FVar9 = tt_cmap14_ensure((TT_CMap14)cmap,FVar7 + uVar6 + 1,memory);
        if (FVar9 == 0) {
          cmap_local = (TT_CMap)cmap[1].cmap.clazz;
          nuni = (uint)pbVar10[4] << 0x10 | (uint)pbVar10[5] << 8 | (uint)pbVar10[6];
          _ni = pbVar10 + 8;
          local_60 = (uint)pbVar10[7];
          k = 1;
          dp._4_4_ = (uint)pbStack_30[4] << 0x10 | (uint)pbStack_30[5] << 8 | (uint)pbStack_30[6];
          pbStack_30 = pbStack_30 + 9;
          local_78 = 1;
          defOff._4_4_ = 0;
          while( true ) {
            while (dp._4_4_ <= nuni + local_60) {
              if (dp._4_4_ < nuni) {
                *(uint *)((long)&((FT_CMap_Class)cmap_local)->size + (long)defOff._4_4_ * 4) =
                     dp._4_4_;
                defOff._4_4_ = defOff._4_4_ + 1;
              }
              local_78 = local_78 + 1;
              if (uVar6 < local_78) goto LAB_0018bcea;
              bVar2 = *pbStack_30;
              pbVar10 = pbStack_30 + 1;
              pbVar1 = pbStack_30 + 2;
              pbStack_30 = pbStack_30 + 5;
              dp._4_4_ = (uint)bVar2 << 0x10 | (uint)*pbVar10 << 8 | (uint)*pbVar1;
            }
            for (ret._4_4_ = 0; ret._4_4_ <= local_60; ret._4_4_ = ret._4_4_ + 1) {
              *(FT_UInt32 *)((long)&((FT_CMap_Class)cmap_local)->size + (long)defOff._4_4_ * 4) =
                   nuni + ret._4_4_;
              defOff._4_4_ = defOff._4_4_ + 1;
            }
            k = k + 1;
            if (uVar8 < k) break;
            pbVar10 = _ni + 3;
            nuni = (uint)*_ni << 0x10 | (uint)_ni[1] << 8 | (uint)_ni[2];
            _ni = _ni + 4;
            local_60 = (uint)*pbVar10;
          }
LAB_0018bcea:
          if (uVar6 < local_78) {
            if (k <= uVar8) {
              for (ret._4_4_ = 0; ret._4_4_ <= local_60; ret._4_4_ = ret._4_4_ + 1) {
                *(FT_UInt32 *)((long)&((FT_CMap_Class)cmap_local)->size + (long)defOff._4_4_ * 4) =
                     nuni + ret._4_4_;
                defOff._4_4_ = defOff._4_4_ + 1;
              }
              for (; k < uVar8; k = k + 1) {
                pbVar10 = _ni + 3;
                bVar2 = *_ni;
                bVar3 = _ni[1];
                bVar4 = _ni[2];
                _ni = _ni + 4;
                bVar5 = *pbVar10;
                for (ret._4_4_ = 0; ret._4_4_ <= bVar5; ret._4_4_ = ret._4_4_ + 1) {
                  *(uint *)((long)&((FT_CMap_Class)cmap_local)->size + (long)defOff._4_4_ * 4) =
                       ((uint)bVar2 << 0x10 | (uint)bVar3 << 8 | (uint)bVar4) + ret._4_4_;
                  defOff._4_4_ = defOff._4_4_ + 1;
                }
              }
            }
          }
          else {
            *(uint *)((long)&((FT_CMap_Class)cmap_local)->size + (long)defOff._4_4_ * 4) = dp._4_4_;
            for (; defOff._4_4_ = defOff._4_4_ + 1, local_78 < uVar6; local_78 = local_78 + 1) {
              *(uint *)((long)&((FT_CMap_Class)cmap_local)->size + (long)defOff._4_4_ * 4) =
                   (uint)*pbStack_30 << 0x10 | (uint)pbStack_30[1] << 8 | (uint)pbStack_30[2];
              pbStack_30 = pbStack_30 + 5;
            }
          }
          *(undefined4 *)((long)&((FT_CMap_Class)cmap_local)->size + (long)defOff._4_4_ * 4) = 0;
        }
        else {
          cmap_local = (TT_CMap)0x0;
        }
      }
    }
  }
  return (FT_UInt32 *)cmap_local;
}

Assistant:

FT_CALLBACK_DEF( FT_UInt32 * )
  tt_cmap14_variant_chars( TT_CMap    cmap,
                           FT_Memory  memory,
                           FT_UInt32  variantSelector )
  {
    FT_Byte    *p  = tt_cmap14_find_variant( cmap->data + 6,
                                             variantSelector );
    FT_Int      i;
    FT_ULong    defOff;
    FT_ULong    nondefOff;


    if ( !p )
      return NULL;

    defOff    = TT_NEXT_ULONG( p );
    nondefOff = TT_NEXT_ULONG( p );

    if ( defOff == 0 && nondefOff == 0 )
      return NULL;

    if ( defOff == 0 )
      return tt_cmap14_get_nondef_chars( cmap, cmap->data + nondefOff,
                                         memory );
    else if ( nondefOff == 0 )
      return tt_cmap14_get_def_chars( cmap, cmap->data + defOff,
                                      memory );
    else
    {
      /* Both a default and a non-default glyph set?  That's probably not */
      /* good font design, but the spec allows for it...                  */
      TT_CMap14  cmap14 = (TT_CMap14) cmap;
      FT_UInt32  numRanges;
      FT_UInt32  numMappings;
      FT_UInt32  duni;
      FT_UInt32  dcnt;
      FT_UInt32  nuni;
      FT_Byte*   dp;
      FT_UInt    di, ni, k;

      FT_UInt32  *ret;


      p  = cmap->data + nondefOff;
      dp = cmap->data + defOff;

      numMappings = (FT_UInt32)TT_NEXT_ULONG( p );
      dcnt        = tt_cmap14_def_char_count( dp );
      numRanges   = (FT_UInt32)TT_NEXT_ULONG( dp );

      if ( numMappings == 0 )
        return tt_cmap14_get_def_chars( cmap, cmap->data + defOff,
                                        memory );
      if ( dcnt == 0 )
        return tt_cmap14_get_nondef_chars( cmap, cmap->data + nondefOff,
                                           memory );

      if ( tt_cmap14_ensure( cmap14, ( dcnt + numMappings + 1 ), memory ) )
        return NULL;

      ret  = cmap14->results;
      duni = (FT_UInt32)TT_NEXT_UINT24( dp );
      dcnt = FT_NEXT_BYTE( dp );
      di   = 1;
      nuni = (FT_UInt32)TT_NEXT_UINT24( p );
      p   += 2;
      ni   = 1;
      i    = 0;

      for (;;)
      {
        if ( nuni > duni + dcnt )
        {
          for ( k = 0; k <= dcnt; k++ )
            ret[i++] = duni + k;

          di++;

          if ( di > numRanges )
            break;

          duni = (FT_UInt32)TT_NEXT_UINT24( dp );
          dcnt = FT_NEXT_BYTE( dp );
        }
        else
        {
          if ( nuni < duni )
            ret[i++] = nuni;
          /* If it is within the default range then ignore it -- */
          /* that should not have happened                       */
          ni++;
          if ( ni > numMappings )
            break;

          nuni = (FT_UInt32)TT_NEXT_UINT24( p );
          p += 2;
        }
      }

      if ( ni <= numMappings )
      {
        /* If we get here then we have run out of all default ranges.   */
        /* We have read one non-default mapping which we haven't stored */
        /* and there may be others that need to be read.                */
        ret[i++] = nuni;
        while ( ni < numMappings )
        {
          ret[i++] = (FT_UInt32)TT_NEXT_UINT24( p );
          p += 2;
          ni++;
        }
      }
      else if ( di <= numRanges )
      {
        /* If we get here then we have run out of all non-default     */
        /* mappings.  We have read one default range which we haven't */
        /* stored and there may be others that need to be read.       */
        for ( k = 0; k <= dcnt; k++ )
          ret[i++] = duni + k;

        while ( di < numRanges )
        {
          duni = (FT_UInt32)TT_NEXT_UINT24( dp );
          dcnt = FT_NEXT_BYTE( dp );

          for ( k = 0; k <= dcnt; k++ )
            ret[i++] = duni + k;
          di++;
        }
      }

      ret[i] = 0;

      return ret;
    }
  }